

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# our_gl.cpp
# Opt level: O0

vec3f * barycentric(vec3f *__return_storage_ptr__,vec2f A,vec2f B,vec2f C,vec2f P)

{
  double dVar1;
  double dVar2;
  double *pdVar3;
  int iVar4;
  vec<3UL,_double> *this;
  double extraout_XMM0_Qa;
  vec<3UL,_double> *local_a0;
  undefined1 local_98 [8];
  vec3f u;
  undefined1 local_78 [4];
  int i;
  vec3f s [2];
  vec2f P_local;
  vec2f C_local;
  vec2f B_local;
  vec2f A_local;
  
  P_local.x = P.y;
  s[1].z = P.x;
  C_local.x = C.y;
  P_local.y = C.x;
  B_local.x = B.y;
  C_local.y = B.x;
  B_local.y = A.x;
  local_a0 = (vec<3UL,_double> *)local_78;
  do {
    vec<3UL,_double>::vec(local_a0);
    local_a0 = local_a0 + 1;
  } while (local_a0 != (vec<3UL,_double> *)&s[1].z);
  u.z._4_4_ = 2;
  while (iVar4 = u.z._4_4_ + -1, u.z._4_4_ != 0) {
    u.z._4_4_ = iVar4;
    pdVar3 = vec<2UL,_double>::operator[]((vec<2UL,_double> *)&P_local.y,(long)iVar4);
    dVar1 = *pdVar3;
    pdVar3 = vec<2UL,_double>::operator[]((vec<2UL,_double> *)&B_local.y,(long)u.z._4_4_);
    dVar2 = *pdVar3;
    pdVar3 = vec<3UL,_double>::operator[]((vec<3UL,_double> *)(local_78 + (long)u.z._4_4_ * 0x18),0)
    ;
    *pdVar3 = dVar1 - dVar2;
    pdVar3 = vec<2UL,_double>::operator[]((vec<2UL,_double> *)&C_local.y,(long)u.z._4_4_);
    dVar1 = *pdVar3;
    pdVar3 = vec<2UL,_double>::operator[]((vec<2UL,_double> *)&B_local.y,(long)u.z._4_4_);
    dVar2 = *pdVar3;
    pdVar3 = vec<3UL,_double>::operator[]((vec<3UL,_double> *)(local_78 + (long)u.z._4_4_ * 0x18),1)
    ;
    *pdVar3 = dVar1 - dVar2;
    pdVar3 = vec<2UL,_double>::operator[]((vec<2UL,_double> *)&B_local.y,(long)u.z._4_4_);
    dVar1 = *pdVar3;
    pdVar3 = vec<2UL,_double>::operator[]((vec<2UL,_double> *)&s[1].z,(long)u.z._4_4_);
    dVar2 = *pdVar3;
    pdVar3 = vec<3UL,_double>::operator[]((vec<3UL,_double> *)(local_78 + (long)u.z._4_4_ * 0x18),2)
    ;
    *pdVar3 = dVar1 - dVar2;
  }
  u.z._4_4_ = iVar4;
  cross((vec3f *)local_98,(vec3f *)local_78,(vec3f *)&s[0].z);
  this = (vec<3UL,_double> *)local_98;
  vec<3UL,_double>::operator[](this,2);
  std::abs((int)this);
  if (extraout_XMM0_Qa <= 0.01) {
    vec<3UL,_double>::vec(__return_storage_ptr__,-1.0,1.0,1.0);
  }
  else {
    vec<3UL,_double>::vec
              (__return_storage_ptr__,1.0 - ((double)local_98 + u.x) / u.y,u.x / u.y,
               (double)local_98 / u.y);
  }
  return __return_storage_ptr__;
}

Assistant:

vec3f barycentric(vec2f A, vec2f B, vec2f C, vec2f P)
{
    vec3f s[2];
    for (int i = 2; i--;) {
        s[i][0] = C[i] - A[i];
        s[i][1] = B[i] - A[i];
        s[i][2] = A[i] - P[i];
    }
    vec3f u = cross(s[0], s[1]);
    if (std::abs(u[2]) >
        1e-2)  // dont forget that u[2] is integer. If it is zero then triangle ABC is degenerate
        return vec3f(1.f - (u.x + u.y) / u.z, u.y / u.z, u.x / u.z);
    return vec3f(-1, 1, 1);  // in this case generate negative coordinates, it will be thrown away
                             // by the rasterizer
}